

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O2

void rfft2d(float *data,long M2,long M)

{
  ulong uVar1;
  long Rows;
  long lVar2;
  long lVar3;
  xdouble *pxVar4;
  ulong iRsiz;
  
  if (M < 1 || M2 < 1) {
    rffts(data,M + M2,1);
    return;
  }
  Rows = 1L << (M2 & 0x3fU);
  rffts(data,M,Rows);
  if (M == 2) {
    lVar3 = 2;
    lVar2 = 2L << (M2 & 0x3fU);
    dxpose((xdouble *)data,2,(xdouble *)(Array2d[M2] + lVar2),Rows,Rows,1);
    xpose(Array2d[M2] + lVar2,2,Array2d[M2],Rows,Rows,2);
    rffts(Array2d[M2],M2,2);
    dxpose((xdouble *)Array2d[M2],Rows,(xdouble *)data,2,1,Rows);
    data = data + 2;
    dxpose((xdouble *)data,2,(xdouble *)Array2d[M2],Rows,Rows,1);
    ffts(Array2d[M2],M2,1);
    pxVar4 = (xdouble *)Array2d[M2];
  }
  else {
    if (M != 1) {
      iRsiz = (ulong)(1L << (M & 0x3fU)) >> 1;
      lVar3 = 2L << (M2 & 0x3fU);
      dxpose((xdouble *)data,iRsiz,(xdouble *)(Array2d[M2] + lVar3),Rows,Rows,1);
      xpose(Array2d[M2] + lVar3,2,Array2d[M2],Rows,Rows,2);
      rffts(Array2d[M2],M2,2);
      dxpose((xdouble *)Array2d[M2],Rows,(xdouble *)data,iRsiz,1,Rows);
      dxpose((xdouble *)(data + 2),iRsiz,(xdouble *)Array2d[M2],Rows,Rows,3);
      ffts(Array2d[M2],M2,3);
      dxpose((xdouble *)Array2d[M2],Rows,(xdouble *)(data + 2),iRsiz,3,Rows);
      pxVar4 = (xdouble *)(data + 8);
      for (uVar1 = 4; uVar1 < iRsiz; uVar1 = uVar1 + 4) {
        dxpose(pxVar4,iRsiz,(xdouble *)Array2d[M2],Rows,Rows,4);
        ffts(Array2d[M2],M2,4);
        dxpose((xdouble *)Array2d[M2],Rows,pxVar4,iRsiz,4,Rows);
        pxVar4 = pxVar4 + 4;
      }
      return;
    }
    lVar2 = 2L << (M2 & 0x3fU);
    lVar3 = 1;
    dxpose((xdouble *)data,1,(xdouble *)(Array2d[M2] + lVar2),Rows,Rows,1);
    xpose(Array2d[M2] + lVar2,2,Array2d[M2],Rows,Rows,2);
    rffts(Array2d[M2],M2,2);
    pxVar4 = (xdouble *)Array2d[M2];
  }
  dxpose(pxVar4,Rows,(xdouble *)data,lVar3,1,Rows);
  return;
}

Assistant:

void rfft2d(float *data, long M2, long M){
/* Compute 2D real fft and return results in-place	*/
/* First performs real fft on rows using size from M to compute positive frequencies */
/* then performs transform on columns using size from M2 to compute wavenumbers */
/* If you think of the result as a complex pow(2,M2) by pow(2,M-1) matrix */
/* then the first column contains the positive wavenumber spectra of DC frequency */
/* followed by the positive wavenumber spectra of the nyquest frequency */
/* since these are two positive wavenumber spectra the first complex value */
/* of each is really the real values for the zero and nyquest wavenumber packed together */
/* All other columns contain the positive and negative wavenumber spectra of a positive frequency */
/* See rspect2dprod for multiplying two of these spectra together- ex. for fast convolution */
/* INPUTS */
/* *data = input data array	*/
/* M2 = log2 of fft size number of rows in */
/* M = log2 of fft size number of columns in */
/* OUTPUTS */
/* *data = output data array	*/
long i1;
if((M2>0)&&(M>0)){
	rffts(data, M, POW2(M2));
	if (M==1){
		cxpose(data, POW2(M)/2, Array2d[M2]+POW2(M2)*2, POW2(M2), POW2(M2), 1);
		xpose(Array2d[M2]+POW2(M2)*2, 2, Array2d[M2], POW2(M2), POW2(M2), 2);
		rffts(Array2d[M2], M2, 2);
		cxpose(Array2d[M2], POW2(M2), data, POW2(M)/2, 1, POW2(M2));
	}
	else if (M==2){
		cxpose(data, POW2(M)/2, Array2d[M2]+POW2(M2)*2, POW2(M2), POW2(M2), 1);
		xpose(Array2d[M2]+POW2(M2)*2, 2, Array2d[M2], POW2(M2), POW2(M2), 2);
		rffts(Array2d[M2], M2, 2);
		cxpose(Array2d[M2], POW2(M2), data, POW2(M)/2, 1, POW2(M2));

		cxpose(data + 2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 1);
		ffts(Array2d[M2], M2, 1);
		cxpose(Array2d[M2], POW2(M2), data + 2, POW2(M)/2, 1, POW2(M2));
	}
	else{
		cxpose(data, POW2(M)/2, Array2d[M2]+POW2(M2)*2, POW2(M2), POW2(M2), 1);
		xpose(Array2d[M2]+POW2(M2)*2, 2, Array2d[M2], POW2(M2), POW2(M2), 2);
		rffts(Array2d[M2], M2, 2);
		cxpose(Array2d[M2], POW2(M2), data, POW2(M)/2, 1, POW2(M2));

		cxpose(data + 2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 3);
		ffts(Array2d[M2], M2, 3);
		cxpose(Array2d[M2], POW2(M2), data + 2, POW2(M)/2, 3, POW2(M2));
		for (i1=4; i1<POW2(M)/2; i1+=4){
			cxpose(data + i1*2, POW2(M)/2, Array2d[M2], POW2(M2), POW2(M2), 4);
			ffts(Array2d[M2], M2, 4);
			cxpose(Array2d[M2], POW2(M2), data + i1*2, POW2(M)/2, 4, POW2(M2));
		}
	}
}
else
	rffts(data, M2+M, 1);
}